

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtxout.cpp
# Opt level: O0

void __thiscall
ConfidentialTxOutReference_GetSerializeVsize_Test::ConfidentialTxOutReference_GetSerializeVsize_Test
          (ConfidentialTxOutReference_GetSerializeVsize_Test *this)

{
  ConfidentialTxOutReference_GetSerializeVsize_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__ConfidentialTxOutReference_GetSerializeVsize_Test_008932e8;
  return;
}

Assistant:

TEST(ConfidentialTxOutReference, GetSerializeVsize) {
  int64_t satoshi = 1000000;
  ConfidentialAssetId asset("1234567890123456789012345678901234567890123456789012345678901234");
  ConfidentialTxOut txout(exp_script, asset,
      ConfidentialValue(Amount::CreateBySatoshiAmount(satoshi)));
  ConfidentialTxOutReference txout_ref(txout);

  EXPECT_EQ(txout_ref.GetSerializeVsize(false), 67);

  EXPECT_EQ(886, txout_ref.GetSerializeVsize(true, 0, 36));

  EXPECT_EQ(1206, txout_ref.GetSerializeVsize(true, 0, 52));

  EXPECT_EQ(1191, txout_ref.GetSerializeVsize(true, 0, 52, nullptr, 2));
}